

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O2

AST * parse_postfix_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  char cVar2;
  AST_Binary_Expression *left;
  token *ptVar3;
  AST_Lvalue_Expression *right;
  AST *right_00;
  AST_Error *pAVar4;
  AST_Function_Expression *pAVar5;
  AST_Type AVar6;
  
  left = (AST_Binary_Expression *)parse_primary_expression(translation_data,scope);
LAB_00142459:
  do {
    while( true ) {
      if (translation_data->tokens->size == 0) {
        return (AST *)left;
      }
      iVar1 = *translation_data->tokens->first->data;
      if (iVar1 != 0x2c) break;
      chomp(translation_data);
      cVar2 = check(translation_data,KW_ID,0);
      if (cVar2 != '\0') {
        ptVar3 = (token *)Queue_Pop(translation_data->tokens);
        right = get_lvalue_expression_tree(ptVar3,scope);
        AVar6 = OP_MEMBER_TROUGH_PTR;
LAB_00142530:
        left = get_binary_expression_tree((AST *)left,(AST *)right,AVar6);
      }
    }
    if (iVar1 != 0x34) {
      if (iVar1 == 0x3d) {
        chomp(translation_data);
        AVar6 = OP_POSTFIX_INC;
      }
      else {
        if (iVar1 != 0x3e) {
          if (iVar1 != 0x4d) {
            if (iVar1 != 0x26) {
              return (AST *)left;
            }
            chomp(translation_data);
            pAVar5 = parse_arglist(translation_data,scope,(AST *)left);
            return (AST *)pAVar5;
          }
          chomp(translation_data);
          cVar2 = check(translation_data,KW_ID,0);
          if (cVar2 != '\0') {
            ptVar3 = (token *)Queue_Pop(translation_data->tokens);
            right = get_lvalue_expression_tree(ptVar3,scope);
            AVar6 = OP_MEMBER;
            goto LAB_00142530;
          }
          goto LAB_00142459;
        }
        chomp(translation_data);
        AVar6 = OP_POSTFIX_DEC;
      }
      left = (AST_Binary_Expression *)get_unary_expression_tree((AST *)left,AVar6);
      goto LAB_00142459;
    }
    chomp(translation_data);
    cVar2 = get_and_check(translation_data,KW_CLOSE_SQUARE);
    if (cVar2 != '\0') {
      right = (AST_Lvalue_Expression *)0x0;
      AVar6 = OP_ARR_SUBSCRIPT;
      goto LAB_00142530;
    }
    right_00 = parse_comma_expression(translation_data,scope);
    left = get_binary_expression_tree((AST *)left,right_00,OP_ARR_SUBSCRIPT);
    cVar2 = get_and_check(translation_data,KW_CLOSE_SQUARE);
    if (cVar2 == '\0') {
      push_translation_error("expected \']\' here",translation_data);
      pAVar4 = get_error_tree((AST *)left);
      return (AST *)pAVar4;
    }
  } while( true );
}

Assistant:

struct AST* parse_postfix_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	struct AST *hold_expr;

	
	hold=parse_primary_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_PLUSPLUS:
				chomp(translation_data);
				hold=(struct AST*)get_unary_expression_tree(hold,OP_POSTFIX_INC);
				break;
			case KW_MINUSMINUS:
				chomp(translation_data);
				hold=(struct AST*)get_unary_expression_tree(hold,OP_POSTFIX_DEC);
				break;
			case KW_DOT:
				chomp(translation_data);
				if(check(translation_data,KW_ID,0))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,(struct AST*)get_lvalue_expression_tree(Queue_Pop(translation_data->tokens),scope),OP_MEMBER);
				}
				break;
			case KW_ARROW:
				chomp(translation_data);
				if(check(translation_data,KW_ID,0))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,(struct AST*)get_lvalue_expression_tree(Queue_Pop(translation_data->tokens),scope),OP_MEMBER_TROUGH_PTR);
				}
				break;
			case KW_OPEN_SQUARE:

				chomp(translation_data);
				if(get_and_check(translation_data,KW_CLOSE_SQUARE))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,NULL,OP_ARR_SUBSCRIPT);
				}else
				{
					hold_expr=parse_expression(translation_data,scope);
					hold=(struct AST*)get_binary_expression_tree(hold,hold_expr,OP_ARR_SUBSCRIPT);
					if(!get_and_check(translation_data,KW_CLOSE_SQUARE))
					{
						push_translation_error("expected ']' here",translation_data);
						return (struct AST*)get_error_tree(hold);
					}
				}
				break;
			case KW_OPEN_NORMAL:
				chomp(translation_data);
				return (struct AST*)parse_arglist(translation_data,scope,hold);
				break;

			default:
				return hold;
		}
	}

	return hold;
}